

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

int __thiscall vm::VM::init(VM *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  VM *this_local;
  
  this->prepared = false;
  this->_sp = 0;
  this->_bp = 0;
  this->_ip = 0;
  this->_counterInstruction = 0;
  std::vector<vm::VM::Context,_std::allocator<vm::VM::Context>_>::clear(&this->_contexts);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear(&this->_heapRecord)
  ;
  std::
  unordered_map<unsigned_short,_int,_std::hash<unsigned_short>,_std::equal_to<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_int>_>_>
  ::clear(&this->_stringLiteralPool);
  return extraout_EAX;
}

Assistant:

void VM::init() noexcept {
    prepared = false;
    _sp = 0;
    _bp = 0;
    _ip = 0;
    _counterInstruction = 0;
    _contexts.clear();
    _heapRecord.clear();
    _stringLiteralPool.clear();
}